

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::VariableDatum::Encode(VariableDatum *this,KDataStream *stream)

{
  pointer pDVar1;
  KUINT16 i;
  long lVar2;
  pointer pDVar3;
  
  KDataStream::Write<unsigned_int>(stream,this->m_ui32DatumID);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32DatumLength);
  pDVar1 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pDVar3 = (this->m_v8DatumValue).
                super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    lVar2 = 0;
    do {
      KDataStream::Write(stream,pDVar3->Buffer[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  return;
}

Assistant:

void VariableDatum::Encode( KDataStream & stream ) const
{
    stream << m_ui32DatumID
           << m_ui32DatumLength;

    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    while( citr != citrEnd )
    {
        for( KUINT16 i = 0; i < 8; ++i )
        {
            stream << citr->Buffer[i];
        }

        ++citr;
    }
}